

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O1

Glyph * __thiscall
sf::Font::getGlyph(Font *this,Uint32 codePoint,uint characterSize,bool bold,float outlineThickness)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  uint uVar3;
  mapped_type *this_00;
  _Rb_tree_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_> _Var4;
  _Base_ptr p_Var5;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_>,_bool> pVar6;
  uint local_64;
  pair<unsigned_long_long,_sf::Glyph> local_60;
  
  local_64 = characterSize;
  this_00 = std::
            map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
            ::operator[](&this->m_pages,&local_64);
  uVar3 = FT_Get_Char_Index(this->m_face,codePoint);
  local_60.first = (ulong)uVar3 | CONCAT44(outlineThickness,(uint)bold << 0x1f);
  p_Var1 = &(this_00->glyphs)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this_00->glyphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0;
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < local_60.first]) {
    if (*(ulong *)(p_Var2 + 1) >= local_60.first) {
      p_Var5 = p_Var2;
    }
  }
  _Var4._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (_Var4._M_node = p_Var5, local_60.first < *(ulong *)(p_Var5 + 1))) {
    _Var4._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)_Var4._M_node == p_Var1) {
    loadGlyph(&local_60.second,this,codePoint,local_64,bold,outlineThickness);
    pVar6 = std::
            _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,sf::Glyph>,std::_Select1st<std::pair<unsigned_long_long_const,sf::Glyph>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,sf::Glyph>>>
            ::_M_emplace_unique<std::pair<unsigned_long_long,sf::Glyph>>
                      ((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,sf::Glyph>,std::_Select1st<std::pair<unsigned_long_long_const,sf::Glyph>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,sf::Glyph>>>
                        *)this_00,&local_60);
    _Var4 = pVar6.first._M_node;
  }
  return (Glyph *)&_Var4._M_node[1]._M_parent;
}

Assistant:

const Glyph& Font::getGlyph(Uint32 codePoint, unsigned int characterSize, bool bold, float outlineThickness) const
{
    // Get the page corresponding to the character size
    GlyphTable& glyphs = m_pages[characterSize].glyphs;

    // Build the key by combining the glyph index (based on code point), bold flag, and outline thickness
    Uint64 key = combine(outlineThickness, bold, FT_Get_Char_Index(static_cast<FT_Face>(m_face), codePoint));

    // Search the glyph into the cache
    GlyphTable::const_iterator it = glyphs.find(key);
    if (it != glyphs.end())
    {
        // Found: just return it
        return it->second;
    }
    else
    {
        // Not found: we have to load it
        Glyph glyph = loadGlyph(codePoint, characterSize, bold, outlineThickness);
        return glyphs.insert(std::make_pair(key, glyph)).first->second;
    }
}